

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

vector<NodeList<Node>_> * __thiscall
vector<NodeList<Node>_>::operator=(vector<NodeList<Node>_> *this,vector<NodeList<Node>_> *other)

{
  NodeList<Node> *this_00;
  uint uVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  vector<Node> *pvVar6;
  long lVar7;
  ulong uVar8;
  NodeList<Node> *this_01;
  ulong *unaff_R15;
  
  uVar1 = other->_size;
  this->_size = uVar1;
  uVar8 = (ulong)other->_capacity;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar8;
  uVar3 = SUB168(auVar2 * ZEXT816(0x18),0);
  uVar4 = uVar3 + 8;
  if (0xfffffffffffffff7 < uVar3) {
    uVar4 = 0xffffffffffffffff;
  }
  this->_capacity = other->_capacity;
  uVar3 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0x18),8) == 0) {
    uVar3 = uVar4;
  }
  puVar5 = (ulong *)operator_new__(uVar3);
  this_00 = (NodeList<Node> *)(puVar5 + 1);
  *puVar5 = uVar8;
  if (uVar8 != 0) {
    lVar7 = 0;
    this_01 = this_00;
    do {
      NodeList<Node>::NodeList(this_01);
      lVar7 = lVar7 + -0x18;
      this_01 = this_01 + 1;
    } while (uVar8 * -0x18 - lVar7 != 0);
    uVar1 = this->_size;
    unaff_R15 = puVar5;
  }
  this->vect = this_00;
  if ((int)uVar1 < 1) {
    return this;
  }
  pvVar6 = vector<Node>::operator=((vector<Node> *)this_00,&other->vect->nodes);
  if ((ulong)uVar1 != 0) {
    lVar7 = -(ulong)uVar1;
    do {
      vector<Node>::~vector((vector<Node> *)((long)unaff_R15 + lVar7 + -0x10));
      lVar7 = lVar7 + -0x18;
    } while (lVar7 != 0);
  }
  operator_delete__(unaff_R15);
  _Unwind_Resume(pvVar6);
}

Assistant:

vector &operator = (const vector &other) {
        _size = other._size;
        _capacity = other._capacity;
        vect = new T[_capacity]();

        for (int i = 0; i < _size; ++i) {
            vect[i] = other[i];
        }

        return *this;
    }